

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

void test_read_num<double,float,int(*)(char_const**,double*)>
               (float num1,_func_int_char_ptr_ptr_double_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  int iVar3;
  int64_t iVar4;
  uint64_t uVar5;
  char *pcVar6;
  undefined8 uVar7;
  long lVar8;
  float fVar9;
  double dVar10;
  char *mp_num_pos1;
  double num2;
  char *mp_num_pos2;
  char mp_nums [16] [16];
  char str [256];
  undefined1 local_38 [8];
  
  builtin_strncpy(str,"typed read of ",0xf);
  iVar3 = snprintf(str + 0xe,0xf2,"%f",0x41590b2200000000);
  pcVar6 = str + (long)iVar3 + 0xe;
  iVar3 = snprintf(pcVar6,(size_t)(local_38 + -(long)pcVar6)," into ");
  snprintf(pcVar6 + iVar3,(size_t)(local_38 + -(long)(pcVar6 + iVar3)),"double");
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fputs(str,_stdout);
  fputc(10,_stdout);
  mp_nums[0][0] = -0x36;
  mp_nums[0][1] = 'J';
  mp_nums[0][2] = -0x38;
  mp_nums[0][3] = 'Y';
  mp_nums[0][4] = '\x10';
  mp_nums[1][0] = -0x35;
  mp_nums[1][1] = 'A';
  mp_nums[1][2] = 'Y';
  mp_nums[1][3] = '\v';
  mp_nums[1][4] = '\"';
  mp_nums[1][5] = '\0';
  mp_nums[1][6] = '\0';
  mp_nums[1][7] = '\0';
  mp_nums[1][8] = '\0';
  lVar8 = 0;
  do {
    if (lVar8 == 0x20) {
      return;
    }
    pcVar6 = mp_nums[0] + lVar8;
    bVar1 = *pcVar6;
    mVar2 = mp_type_hint[bVar1];
    mp_num_pos1 = pcVar6;
    if (mVar2 == MP_UINT) {
      uVar5 = mp_decode_uint(&mp_num_pos1);
      if (uVar5 != 0x642c88) {
        pcVar6 = "mp_decode_uint(&mp_num_pos1) == (uint64_t)num1";
        uVar7 = 0x72a;
        goto LAB_00125ee0;
      }
    }
    else if (mVar2 == MP_FLOAT) {
      fVar9 = mp_decode_float(&mp_num_pos1);
      if ((fVar9 != 6.565e+06) || (NAN(fVar9))) {
        pcVar6 = "mp_decode_float(&mp_num_pos1) == (float)num1";
        uVar7 = 0x72d;
        goto LAB_00125ee0;
      }
    }
    else if (mVar2 == MP_INT) {
      iVar4 = mp_decode_int(&mp_num_pos1);
      if (iVar4 != 0x642c88) {
        pcVar6 = "mp_decode_int(&mp_num_pos1) == (int64_t)num1";
        uVar7 = 0x727;
LAB_00125ee0:
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar6,"false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,uVar7,"test_read_num");
        exit(-1);
      }
    }
    else {
      dVar10 = mp_decode_double(&mp_num_pos1);
      if ((dVar10 != 6565000.0) || (NAN(dVar10))) {
        pcVar6 = "mp_decode_double(&mp_num_pos1) == (double)num1";
        uVar7 = 0x730;
        goto LAB_00125ee0;
      }
    }
    num2 = 0.0;
    mp_num_pos2 = pcVar6;
    iVar3 = (*read_f)(&mp_num_pos2,&num2);
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
    _ok((uint)(mp_num_pos1 == mp_num_pos2),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    _ok((uint)(ABS(6565000.0 - num2) < 1e-15),"double_eq(num1, num2)",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73e,"check float number");
    lVar8 = lVar8 + 0x10;
  } while( true );
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}